

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

CBlockLocator * __thiscall
HeadersSyncState::NextHeadersRequestLocator
          (CBlockLocator *__return_storage_ptr__,HeadersSyncState *this)

{
  State SVar1;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> locator;
  vector<uint256,_std::allocator<uint256>_> chain_start_locator;
  _Vector_base<uint256,_std::allocator<uint256>_> local_68;
  _Vector_base<uint256,_std::allocator<uint256>_> local_50;
  uint256 local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_download_state == FINAL) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_003bfd6d:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    LocatorEntries((vector<uint256,_std::allocator<uint256>_> *)&local_50,this->m_chain_start);
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (uint256 *)0x0;
    SVar1 = this->m_download_state;
    if (SVar1 == PRESYNC) {
      CBlockHeader::GetHash(&local_38,&this->m_last_header_received);
      std::vector<uint256,_std::allocator<uint256>_>::emplace_back<uint256>
                ((vector<uint256,_std::allocator<uint256>_> *)&local_68,&local_38);
      SVar1 = this->m_download_state;
    }
    if (SVar1 == REDOWNLOAD) {
      std::vector<uint256,_std::allocator<uint256>_>::push_back
                ((vector<uint256,_std::allocator<uint256>_> *)&local_68,
                 &this->m_redownload_buffer_last_hash);
    }
    std::vector<uint256,std::allocator<uint256>>::
    insert<__gnu_cxx::__normal_iterator<uint256*,std::vector<uint256,std::allocator<uint256>>>,void>
              ((vector<uint256,std::allocator<uint256>> *)&local_68,
               (const_iterator)local_68._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>)
               local_50._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_>)
               local_50._M_impl.super__Vector_impl_data._M_finish);
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_68);
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_003bfd6d;
  }
  return __return_storage_ptr__;
}

Assistant:

CBlockLocator HeadersSyncState::NextHeadersRequestLocator() const
{
    Assume(m_download_state != State::FINAL);
    if (m_download_state == State::FINAL) return {};

    auto chain_start_locator = LocatorEntries(m_chain_start);
    std::vector<uint256> locator;

    if (m_download_state == State::PRESYNC) {
        // During pre-synchronization, we continue from the last header received.
        locator.push_back(m_last_header_received.GetHash());
    }

    if (m_download_state == State::REDOWNLOAD) {
        // During redownload, we will download from the last received header that we stored.
        locator.push_back(m_redownload_buffer_last_hash);
    }

    locator.insert(locator.end(), chain_start_locator.begin(), chain_start_locator.end());

    return CBlockLocator{std::move(locator)};
}